

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

void __thiscall cmOrderDirectories::OrderDirectories(cmOrderDirectories *this)

{
  size_type sVar1;
  uint local_14;
  uint i;
  cmOrderDirectories *this_local;
  
  this->CycleDiagnosed = false;
  this->WalkId = 0;
  local_14 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->OriginalDirectories);
    if (sVar1 <= local_14) break;
    this->WalkId = this->WalkId + 1;
    VisitDirectory(this,local_14);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void cmOrderDirectories::OrderDirectories()
{
  // Allow a cycle to be diagnosed once.
  this->CycleDiagnosed = false;
  this->WalkId = 0;

  // Iterate through the directories in the original order.
  for(unsigned int i=0; i < this->OriginalDirectories.size(); ++i)
    {
    // Start a new DFS from this node.
    ++this->WalkId;
    this->VisitDirectory(i);
    }
}